

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O1

void __thiscall Solver::solve(Solver *this,int algorithm)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  Board *board;
  pointer pBVar3;
  Block block;
  Block block_00;
  Block block_01;
  Block block_02;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  _Elt_pointer pBVar20;
  _Elt_pointer pBVar21;
  _Elt_pointer pBVar22;
  _Map_pointer ppBVar23;
  bool bVar24;
  uint uVar25;
  mapped_type *pmVar26;
  ulong uVar27;
  iterator iVar28;
  mapped_type *pmVar29;
  ulong uVar30;
  long lVar31;
  char *pcVar32;
  Board *pBVar33;
  Solver *pSVar34;
  long __holeIndex;
  long lVar35;
  int iVar36;
  long lVar37;
  bool bVar38;
  _Map_pointer ppBStack_6f8;
  Board *pBStack_6f0;
  _Deque_iterator<Board,_Board_&,_Board_*> _Stack_6e8;
  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_karakanb[P]unblock_me_solver_src_Solver_cpp:180:16)>
  pStack_6c8;
  vector<Block,_std::allocator<Block>_> *pvStack_670;
  _Alloc_hider *p_Stack_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_660;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_650;
  char *pcStack_648;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_karakanb[P]unblock_me_solver_src_Solver_cpp:180:16)>
  _Stack_640;
  _Elt_pointer pBStack_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_630;
  char *pcStack_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_618;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_610;
  undefined8 uStack_608;
  undefined8 uStack_600;
  undefined1 auStack_5a0 [16];
  char *pcStack_590;
  Solver *pSStack_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_550;
  int aiStack_548 [2];
  int aiStack_540 [2];
  int iStack_538;
  int aiStack_528 [2];
  int aiStack_520 [2];
  int iStack_518;
  undefined1 auStack_510 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_500;
  _Alloc_hider _Stack_4f0;
  size_type sStack_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4e0;
  vector<Block,_std::allocator<Block>_> vStack_4d0;
  undefined1 auStack_4b8 [24];
  _Elt_pointer pBStack_4a0;
  _Elt_pointer pBStack_498;
  _Base_ptr p_Stack_490;
  _Elt_pointer pBStack_488;
  _Elt_pointer pBStack_480;
  _Elt_pointer pBStack_478;
  pointer pBStack_470;
  key_type kStack_428;
  _Alloc_hider a_Stack_408 [2];
  char acStack_3f8 [16];
  vector<Block,_std::allocator<Block>_> vStack_3e8;
  undefined1 auStack_3d0 [144];
  key_type kStack_340;
  _Alloc_hider a_Stack_320 [2];
  char acStack_310 [16];
  vector<Block,_std::allocator<Block>_> vStack_300;
  Board BStack_2e8;
  Board BStack_200;
  Board BStack_118;
  
  if (algorithm == 1) {
    vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    aStack_4e0._8_8_ = (Board *)0x0;
    vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    sStack_4e8 = 0;
    aStack_4e0._M_allocated_capacity = 0;
    aStack_500._8_8_ = (Board *)0x0;
    _Stack_4f0._M_p = (pointer)0x0;
    auStack_510._8_8_ = 0;
    aStack_500._M_allocated_capacity = 0;
    uStack_600._0_4_ = 0x108438;
    uStack_600._4_4_ = 0;
    std::_Deque_base<Board,_std::allocator<Board>_>::_M_initialize_map
              ((_Deque_base<Board,_std::allocator<Board>_> *)(auStack_510 + 8),0);
    uStack_600._0_4_ = 0x108444;
    uStack_600._4_4_ = 0;
    std::deque<Board,_std::allocator<Board>_>::push_back
              ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8),&this->board);
    auStack_5a0._0_8_ = &vStack_300;
    paStack_550 = &BStack_200.referrer.field_2;
    paStack_558 = &BStack_118.referrer.field_2;
    auStack_5a0._8_8_ = a_Stack_320;
    paStack_578 = &BStack_2e8.referrer.field_2;
    pcVar32 = acStack_310;
    paStack_560 = &BStack_200.identifier.field_2;
    paStack_568 = &BStack_118.identifier.field_2;
    paStack_580 = &BStack_2e8.identifier.field_2;
    paStack_570 = &kStack_340.field_2;
    pmVar1 = &this->pastSteps;
    p_Var2 = &(this->pastSteps)._M_t._M_impl.super__Rb_tree_header;
    pcStack_590 = pcVar32;
    pSStack_588 = this;
    do {
      if (aStack_4e0._8_8_ == aStack_500._8_8_) break;
      uStack_600._0_4_ = 0x10854f;
      uStack_600._4_4_ = 0;
      Board::Board((Board *)auStack_3d0,(Board *)aStack_500._8_8_);
      uStack_600._0_4_ = 0x10855c;
      uStack_600._4_4_ = 0;
      std::deque<Board,_std::allocator<Board>_>::pop_front
                ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8));
      uStack_600._0_4_ = 0x108564;
      uStack_600._4_4_ = 0;
      bVar38 = Board::isCompleted((Board *)auStack_3d0);
      if (bVar38) {
        uStack_600._0_4_ = 0x10857f;
        uStack_600._4_4_ = 0;
        Board::Board(&BStack_2e8,(Board *)auStack_3d0);
        uStack_600._0_4_ = 0x10858f;
        uStack_600._4_4_ = 0;
        constructSolutionSteps(this,&BStack_2e8);
        if (BStack_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          uStack_600._0_4_ = 0x1085a1;
          uStack_600._4_4_ = 0;
          operator_delete(BStack_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)BStack_2e8.referrer._M_dataplus._M_p != paStack_578) {
          uStack_600._0_4_ = 0x1085b8;
          uStack_600._4_4_ = 0;
          operator_delete(BStack_2e8.referrer._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)BStack_2e8.identifier._M_dataplus._M_p != paStack_580) {
          uStack_600._0_4_ = 0x1085d0;
          uStack_600._4_4_ = 0;
          operator_delete(BStack_2e8.identifier._M_dataplus._M_p);
        }
      }
      else {
        if (vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar27 = 0;
          do {
            uStack_600._0_4_ = 0x108602;
            uStack_600._4_4_ = 0;
            bVar24 = Block::isHorizontal(vStack_300.
                                         super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                         super__Vector_impl_data._M_start + uVar27);
            if (bVar24) {
              iVar36 = 0;
              do {
                pBVar3 = vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar27;
                aiStack_528[0] = pBVar3->id;
                aiStack_528[1] = pBVar3->row;
                aiStack_520[0] = pBVar3->column;
                aiStack_520[1] = pBVar3->length;
                uVar4 = pBVar3->id;
                uVar5 = pBVar3->row;
                uVar6 = pBVar3->column;
                uVar7 = pBVar3->length;
                block_01.length = uVar7;
                block_01.column = uVar6;
                block_01.row = uVar5;
                block_01.id = uVar4;
                iStack_518 = vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar27].direction;
                uStack_600._0_4_ = 0x10864e;
                uStack_600._4_4_ = 0;
                block_01.direction = iStack_518;
                bVar24 = Board::canMove((Board *)auStack_3d0,block_01,iVar36);
                if (bVar24) {
                  uStack_600._0_4_ = 0x108669;
                  uStack_600._4_4_ = 0;
                  pSVar34 = (Solver *)auStack_3d0;
                  Board::Board(&BStack_118,(Board *)auStack_3d0);
                  uStack_600._0_4_ = 0x10867f;
                  uStack_600._4_4_ = 0;
                  createMovedInstance((Board *)auStack_4b8,pSVar34,&BStack_118,(int)uVar27,iVar36);
                  if (BStack_118.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    uStack_600._0_4_ = 0x108691;
                    uStack_600._4_4_ = 0;
                    operator_delete(BStack_118.blocks.
                                    super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)BStack_118.referrer._M_dataplus._M_p != paStack_558) {
                    uStack_600._0_4_ = 0x1086a8;
                    uStack_600._4_4_ = 0;
                    operator_delete(BStack_118.referrer._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)BStack_118.identifier._M_dataplus._M_p != paStack_568) {
                    uStack_600._0_4_ = 0x1086bf;
                    uStack_600._4_4_ = 0;
                    operator_delete(BStack_118.identifier._M_dataplus._M_p);
                  }
                  uStack_600._0_4_ = 0x1086cc;
                  uStack_600._4_4_ = 0;
                  iVar28 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                           ::find(&pmVar1->_M_t,&kStack_428);
                  if ((_Rb_tree_header *)iVar28._M_node == p_Var2) {
                    uStack_600._0_4_ = 0x1086e0;
                    uStack_600._4_4_ = 0;
                    pmVar29 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                              ::operator[](pmVar1,&kStack_428);
                    uStack_600._0_4_ = 0x1086f8;
                    uStack_600._4_4_ = 0;
                    memcpy(pmVar29,auStack_4b8,0x90);
                    uStack_600._0_4_ = 0x108707;
                    uStack_600._4_4_ = 0;
                    std::__cxx11::string::_M_assign((string *)&pmVar29->identifier);
                    uStack_600._0_4_ = 0x108718;
                    uStack_600._4_4_ = 0;
                    std::__cxx11::string::_M_assign((string *)&pmVar29->referrer);
                    uStack_600._0_4_ = 0x10872c;
                    uStack_600._4_4_ = 0;
                    std::vector<Block,_std::allocator<Block>_>::operator=
                              (&pmVar29->blocks,&vStack_3e8);
                    uStack_600._0_4_ = 0x108741;
                    uStack_600._4_4_ = 0;
                    std::deque<Board,_std::allocator<Board>_>::push_front
                              ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8),
                               (value_type *)auStack_4b8);
                  }
                  if (vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    uStack_600._0_4_ = 0x108753;
                    uStack_600._4_4_ = 0;
                    operator_delete(vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (a_Stack_408[0]._M_p != acStack_3f8) {
                    uStack_600._0_4_ = 0x108767;
                    uStack_600._4_4_ = 0;
                    operator_delete(a_Stack_408[0]._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)kStack_428._M_dataplus._M_p != &kStack_428.field_2) {
                    uStack_600._0_4_ = 0x10877b;
                    uStack_600._4_4_ = 0;
                    operator_delete(kStack_428._M_dataplus._M_p);
                  }
                }
                iVar36 = iVar36 + 1;
              } while (iVar36 == 1);
            }
            else {
              iVar36 = 2;
              do {
                pBVar3 = vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar27;
                aiStack_548[0] = pBVar3->id;
                aiStack_548[1] = pBVar3->row;
                aiStack_540[0] = pBVar3->column;
                aiStack_540[1] = pBVar3->length;
                uVar8 = pBVar3->id;
                uVar9 = pBVar3->row;
                uVar10 = pBVar3->column;
                uVar11 = pBVar3->length;
                block_02.length = uVar11;
                block_02.column = uVar10;
                block_02.row = uVar9;
                block_02.id = uVar8;
                iStack_538 = vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar27].direction;
                uStack_600._0_4_ = 0x1087d4;
                uStack_600._4_4_ = 0;
                block_02.direction = iStack_538;
                bVar24 = Board::canMove((Board *)auStack_3d0,block_02,iVar36);
                if (bVar24) {
                  uStack_600._0_4_ = 0x1087ef;
                  uStack_600._4_4_ = 0;
                  pSVar34 = (Solver *)auStack_3d0;
                  Board::Board(&BStack_200,(Board *)auStack_3d0);
                  uStack_600._0_4_ = 0x108805;
                  uStack_600._4_4_ = 0;
                  createMovedInstance((Board *)auStack_4b8,pSVar34,&BStack_200,(int)uVar27,iVar36);
                  if (BStack_200.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    uStack_600._0_4_ = 0x108817;
                    uStack_600._4_4_ = 0;
                    operator_delete(BStack_200.blocks.
                                    super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)BStack_200.referrer._M_dataplus._M_p != paStack_550) {
                    uStack_600._0_4_ = 0x10882e;
                    uStack_600._4_4_ = 0;
                    operator_delete(BStack_200.referrer._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)BStack_200.identifier._M_dataplus._M_p != paStack_560) {
                    uStack_600._0_4_ = 0x108845;
                    uStack_600._4_4_ = 0;
                    operator_delete(BStack_200.identifier._M_dataplus._M_p);
                  }
                  uStack_600._0_4_ = 0x108852;
                  uStack_600._4_4_ = 0;
                  iVar28 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                           ::find(&pmVar1->_M_t,&kStack_428);
                  if ((_Rb_tree_header *)iVar28._M_node == p_Var2) {
                    uStack_600._0_4_ = 0x108866;
                    uStack_600._4_4_ = 0;
                    pmVar29 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                              ::operator[](pmVar1,&kStack_428);
                    uStack_600._0_4_ = 0x10887e;
                    uStack_600._4_4_ = 0;
                    memcpy(pmVar29,auStack_4b8,0x90);
                    uStack_600._0_4_ = 0x10888d;
                    uStack_600._4_4_ = 0;
                    std::__cxx11::string::_M_assign((string *)&pmVar29->identifier);
                    uStack_600._0_4_ = 0x10889e;
                    uStack_600._4_4_ = 0;
                    std::__cxx11::string::_M_assign((string *)&pmVar29->referrer);
                    uStack_600._0_4_ = 0x1088b2;
                    uStack_600._4_4_ = 0;
                    std::vector<Block,_std::allocator<Block>_>::operator=
                              (&pmVar29->blocks,&vStack_3e8);
                    uStack_600._0_4_ = 0x1088c7;
                    uStack_600._4_4_ = 0;
                    std::deque<Board,_std::allocator<Board>_>::push_front
                              ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8),
                               (value_type *)auStack_4b8);
                  }
                  if (vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    uStack_600._0_4_ = 0x1088d9;
                    uStack_600._4_4_ = 0;
                    operator_delete(vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (a_Stack_408[0]._M_p != acStack_3f8) {
                    uStack_600._0_4_ = 0x1088ed;
                    uStack_600._4_4_ = 0;
                    operator_delete(a_Stack_408[0]._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)kStack_428._M_dataplus._M_p != &kStack_428.field_2) {
                    uStack_600._0_4_ = 0x108901;
                    uStack_600._4_4_ = 0;
                    operator_delete(kStack_428._M_dataplus._M_p);
                  }
                }
                iVar36 = iVar36 + 1;
              } while (iVar36 != 4);
            }
            uVar27 = uVar27 + 1;
            uVar30 = ((long)vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
          } while (uVar27 <= uVar30 && uVar30 - uVar27 != 0);
        }
        uStack_600._0_4_ = 0x10894e;
        uStack_600._4_4_ = 0;
        pmVar29 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                  ::operator[](pmVar1,&kStack_340);
        this = pSStack_588;
        pcVar32 = pcStack_590;
        uStack_600._0_4_ = 0x10896b;
        uStack_600._4_4_ = 0;
        memcpy(pmVar29,(Solver *)auStack_3d0,0x90);
        uStack_600._0_4_ = 0x10897c;
        uStack_600._4_4_ = 0;
        std::__cxx11::string::_M_assign((string *)&pmVar29->identifier);
        uStack_600._0_4_ = 0x10898d;
        uStack_600._4_4_ = 0;
        std::__cxx11::string::_M_assign((string *)&pmVar29->referrer);
        uStack_600._0_4_ = 0x1089a1;
        uStack_600._4_4_ = 0;
        std::vector<Block,_std::allocator<Block>_>::operator=
                  (&pmVar29->blocks,(vector<Block,_std::allocator<Block>_> *)auStack_5a0._0_8_);
      }
      if (vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        uStack_600._0_4_ = 0x1089b3;
        uStack_600._4_4_ = 0;
        operator_delete(vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (a_Stack_320[0]._M_p != pcVar32) {
        uStack_600._0_4_ = 0x1089c5;
        uStack_600._4_4_ = 0;
        operator_delete(a_Stack_320[0]._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)kStack_340._M_dataplus._M_p != paStack_570) {
        uStack_600._0_4_ = 0x1089dc;
        uStack_600._4_4_ = 0;
        operator_delete(kStack_340._M_dataplus._M_p);
      }
    } while (!bVar38);
    uStack_600._0_4_ = 0x1089f4;
    uStack_600._4_4_ = 0;
    std::deque<Board,_std::allocator<Board>_>::~deque
              ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8));
    return;
  }
  if (algorithm == 0) {
    solveBFS(this);
    return;
  }
  uStack_608 = 0;
  uStack_600._0_4_ = _S_red;
  uStack_600._4_4_ = 0;
  pmVar26 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&uStack_608,&(this->board).identifier);
  *pmVar26 = 0;
  pBStack_478 = (_Elt_pointer)0x0;
  pBStack_470 = (pointer)0x0;
  pBStack_488 = (_Elt_pointer)0x0;
  pBStack_480 = (_Elt_pointer)0x0;
  pBStack_498 = (_Elt_pointer)0x0;
  p_Stack_490 = (_Base_ptr)0x0;
  auStack_4b8._16_8_ = (_Elt_pointer)0x0;
  pBStack_4a0 = (_Elt_pointer)0x0;
  auStack_4b8._0_8_ = (_Map_pointer)0x0;
  auStack_4b8._8_8_ = 0;
  std::_Deque_base<Board,_std::allocator<Board>_>::_M_initialize_map
            ((_Deque_base<Board,_std::allocator<Board>_> *)auStack_4b8,0);
  std::_Deque_base<Board,_std::allocator<Board>_>::_Deque_base
            ((_Deque_base<Board,_std::allocator<Board>_> *)&pStack_6c8,
             (_Deque_base<Board,_std::allocator<Board>_> *)auStack_4b8);
  ppBVar23 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pBVar22 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pBVar21 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
            super__Deque_impl_data._M_start._M_first;
  pBVar20 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pStack_6c8.comp.steps =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        *)&uStack_608;
  lVar35 = ((long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_start._M_last -
            (long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur >> 3) * 0x34f72c234f72c235 +
           ((long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur -
            (long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first >> 3) * 0x34f72c234f72c235 +
           (((long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node -
             (long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_start._M_node >> 3) + -1 +
           (ulong)(pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 2;
  if (1 < lVar35) {
    lVar31 = (long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur -
             (long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first;
    __holeIndex = (lVar35 - (lVar35 + -2 >> 0x3f)) + -2 >> 1;
    do {
      uVar27 = (lVar31 >> 3) * 0x34f72c234f72c235 + __holeIndex;
      if (uVar27 < 2) {
        pBVar33 = pBVar20 + __holeIndex;
      }
      else {
        pBVar33 = ppBVar23[uVar27 >> 1] + uVar27 + (uVar27 >> 1) * -2;
      }
      Board::Board((Board *)auStack_5a0,pBVar33);
      _Stack_6e8._M_cur = pBVar20;
      _Stack_6e8._M_first = pBVar21;
      _Stack_6e8._M_last = pBVar22;
      _Stack_6e8._M_node = ppBVar23;
      Board::Board((Board *)auStack_3d0,(Board *)auStack_5a0);
      std::
      __adjust_heap<std::_Deque_iterator<Board,Board&,Board*>,long,Board,__gnu_cxx::__ops::_Iter_comp_iter<Solver::solveDijkstra()::__0>>
                (&_Stack_6e8,__holeIndex,lVar35,(Board *)auStack_3d0,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_karakanb[P]unblock_me_solver_src_Solver_cpp:180:16)>
                  )&uStack_608);
      if (vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (a_Stack_320[0]._M_p != acStack_310) {
        operator_delete(a_Stack_320[0]._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)kStack_340._M_dataplus._M_p != &kStack_340.field_2) {
        operator_delete(kStack_340._M_dataplus._M_p);
      }
      lVar37 = __holeIndex + -1;
      if (__holeIndex == 0) {
        lVar37 = 0;
      }
      if (vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_4f0._M_p != &aStack_4e0) {
        operator_delete(_Stack_4f0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_510._0_8_ != &aStack_500) {
        operator_delete((void *)auStack_510._0_8_);
      }
      bVar38 = __holeIndex != 0;
      __holeIndex = lVar37;
    } while (bVar38);
  }
  std::deque<Board,_std::allocator<Board>_>::~deque
            ((deque<Board,_std::allocator<Board>_> *)auStack_4b8);
  std::
  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karakanb[P]unblock-me-solver/src/Solver.cpp:180:16)>
  ::push(&pStack_6c8,&this->board);
  pcStack_648 = acStack_310;
  pvStack_670 = &vStack_3e8;
  paStack_610 = &BStack_118.referrer.field_2;
  p_Stack_668 = a_Stack_408;
  paStack_650 = &BStack_2e8.referrer.field_2;
  pcStack_628 = acStack_3f8;
  paStack_658 = &kStack_340.field_2;
  paStack_618 = &BStack_200.identifier.field_2;
  paStack_620 = &BStack_118.identifier.field_2;
  paStack_660 = &BStack_2e8.identifier.field_2;
  paStack_630 = &kStack_428.field_2;
  pmVar1 = &this->pastSteps;
  p_Var2 = &(this->pastSteps)._M_t._M_impl.super__Rb_tree_header;
  do {
    if (pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data
        ._M_finish._M_cur ==
        pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data
        ._M_start._M_cur) break;
    Board::Board((Board *)auStack_4b8,
                 pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur);
    ppBVar23 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    pBVar21 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    pBVar20 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    lVar35 = ((long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                    super__Deque_impl_data._M_start._M_last -
              (long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur >> 3) * 0x34f72c234f72c235;
    if (1 < (long)(((long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur -
                    (long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_first >> 3) * 0x34f72c234f72c235 +
                   lVar35 + (((long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_node -
                              (long)pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                            (ulong)(pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_node ==
                                   (_Map_pointer)0x0)) * 2)) {
      if (pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pBStack_6f0 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node[-1];
        ppBStack_6f8 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + -1;
        pBVar33 = pBStack_6f0 + 2;
      }
      else {
        ppBStack_6f8 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node;
        pBStack_6f0 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first;
        pBVar33 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
      }
      pBStack_638 = pStack_6c8.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                    super__Deque_impl_data._M_start._M_first;
      _Stack_640._M_comp.steps =
           (anon_class_8_1_a8a4c247)(anon_class_8_1_a8a4c247)pStack_6c8.comp.steps;
      board = pBVar33 + -1;
      Board::Board((Board *)auStack_5a0,board);
      memcpy(board,pBVar20,0x90);
      std::__cxx11::string::_M_assign((string *)&pBVar33[-1].identifier);
      std::__cxx11::string::_M_assign((string *)&pBVar33[-1].referrer);
      std::vector<Block,_std::allocator<Block>_>::operator=(&pBVar33[-1].blocks,&pBVar20->blocks);
      _Stack_6e8._M_cur = pBVar20;
      _Stack_6e8._M_first = pBStack_638;
      _Stack_6e8._M_last = pBVar21;
      _Stack_6e8._M_node = ppBVar23;
      Board::Board((Board *)auStack_3d0,(Board *)auStack_5a0);
      std::
      __adjust_heap<std::_Deque_iterator<Board,Board&,Board*>,long,Board,__gnu_cxx::__ops::_Iter_comp_iter<Solver::solveDijkstra()::__0>>
                (&_Stack_6e8,0,
                 lVar35 + (((long)ppBStack_6f8 - (long)ppBVar23 >> 3) + -1 +
                          (ulong)(ppBStack_6f8 == (_Map_pointer)0x0)) * 2 +
                 ((long)board - (long)pBStack_6f0 >> 3) * 0x34f72c234f72c235,(Board *)auStack_3d0,
                 _Stack_640);
      if (vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (a_Stack_320[0]._M_p != pcStack_648) {
        operator_delete(a_Stack_320[0]._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)kStack_340._M_dataplus._M_p != paStack_658) {
        operator_delete(kStack_340._M_dataplus._M_p);
      }
      if (vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_4f0._M_p != &aStack_4e0) {
        operator_delete(_Stack_4f0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_510._0_8_ != &aStack_500) {
        operator_delete((void *)auStack_510._0_8_);
      }
    }
    std::deque<Board,_std::allocator<Board>_>::pop_back(&pStack_6c8.c);
    bVar38 = Board::isCompleted((Board *)auStack_4b8);
    if (bVar38) {
      Board::Board(&BStack_2e8,(Board *)auStack_4b8);
      constructSolutionSteps(this,&BStack_2e8);
      if (BStack_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(BStack_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)BStack_2e8.referrer._M_dataplus._M_p != paStack_650) {
        operator_delete(BStack_2e8.referrer._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)BStack_2e8.identifier._M_dataplus._M_p != paStack_660) {
        operator_delete(BStack_2e8.identifier._M_dataplus._M_p);
      }
    }
    else {
      pmVar26 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)&uStack_608,&kStack_428);
      if (vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar25 = *pmVar26 + 1;
        uVar27 = 0;
        do {
          bVar24 = Block::isHorizontal(vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>.
                                       _M_impl.super__Vector_impl_data._M_start + uVar27);
          if (bVar24) {
            iVar36 = 0;
            do {
              pBVar3 = vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar27;
              uVar12 = pBVar3->id;
              uVar13 = pBVar3->row;
              uVar14 = pBVar3->column;
              uVar15 = pBVar3->length;
              block.length = uVar15;
              block.column = uVar14;
              block.row = uVar13;
              block.id = uVar12;
              block.direction =
                   vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar27].direction;
              bVar24 = Board::canMove((Board *)auStack_4b8,block,iVar36);
              if (bVar24) {
                pSVar34 = (Solver *)auStack_4b8;
                Board::Board(&BStack_118,(Board *)auStack_4b8);
                createMovedInstance((Board *)auStack_5a0,pSVar34,&BStack_118,(int)uVar27,iVar36);
                if (BStack_118.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(BStack_118.blocks.
                                  super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                  super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)BStack_118.referrer._M_dataplus._M_p != paStack_610) {
                  operator_delete(BStack_118.referrer._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)BStack_118.identifier._M_dataplus._M_p != paStack_620) {
                  operator_delete(BStack_118.identifier._M_dataplus._M_p);
                }
                iVar28 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::find(&pmVar1->_M_t,(key_type *)auStack_510);
                if (((_Rb_tree_header *)iVar28._M_node == p_Var2) ||
                   (pmVar26 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                            *)&uStack_608,(key_type *)auStack_510),
                   uVar25 < *pmVar26)) {
                  pmVar26 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                          *)&uStack_608,(key_type *)auStack_510);
                  *pmVar26 = uVar25;
                  pmVar29 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                            ::operator[](pmVar1,(key_type *)auStack_510);
                  memcpy(pmVar29,auStack_5a0,0x90);
                  std::__cxx11::string::_M_assign((string *)&pmVar29->identifier);
                  std::__cxx11::string::_M_assign((string *)&pmVar29->referrer);
                  std::vector<Block,_std::allocator<Block>_>::operator=
                            (&pmVar29->blocks,&vStack_4d0);
                  std::
                  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karakanb[P]unblock-me-solver/src/Solver.cpp:180:16)>
                  ::push(&pStack_6c8,(value_type *)auStack_5a0);
                }
                if (vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Stack_4f0._M_p != &aStack_4e0) {
                  operator_delete(_Stack_4f0._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)auStack_510._0_8_ != &aStack_500) {
                  operator_delete((void *)auStack_510._0_8_);
                }
              }
              iVar36 = iVar36 + 1;
            } while (iVar36 == 1);
          }
          else {
            iVar36 = 2;
            do {
              pBVar3 = vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar27;
              uVar16 = pBVar3->id;
              uVar17 = pBVar3->row;
              uVar18 = pBVar3->column;
              uVar19 = pBVar3->length;
              block_00.length = uVar19;
              block_00.column = uVar18;
              block_00.row = uVar17;
              block_00.id = uVar16;
              block_00.direction =
                   vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar27].direction;
              bVar24 = Board::canMove((Board *)auStack_4b8,block_00,iVar36);
              if (bVar24) {
                pSVar34 = (Solver *)auStack_4b8;
                Board::Board(&BStack_200,(Board *)auStack_4b8);
                createMovedInstance((Board *)auStack_5a0,pSVar34,&BStack_200,(int)uVar27,iVar36);
                if (BStack_200.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(BStack_200.blocks.
                                  super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                  super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)BStack_200.referrer._M_dataplus._M_p != &BStack_200.referrer.field_2) {
                  operator_delete(BStack_200.referrer._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)BStack_200.identifier._M_dataplus._M_p != paStack_618) {
                  operator_delete(BStack_200.identifier._M_dataplus._M_p);
                }
                iVar28 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::find(&pmVar1->_M_t,(key_type *)auStack_510);
                if (((_Rb_tree_header *)iVar28._M_node == p_Var2) ||
                   (pmVar26 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                            *)&uStack_608,(key_type *)auStack_510),
                   uVar25 < *pmVar26)) {
                  pmVar26 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                          *)&uStack_608,(key_type *)auStack_510);
                  *pmVar26 = uVar25;
                  pmVar29 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                            ::operator[](pmVar1,(key_type *)auStack_510);
                  memcpy(pmVar29,auStack_5a0,0x90);
                  std::__cxx11::string::_M_assign((string *)&pmVar29->identifier);
                  std::__cxx11::string::_M_assign((string *)&pmVar29->referrer);
                  std::vector<Block,_std::allocator<Block>_>::operator=
                            (&pmVar29->blocks,&vStack_4d0);
                  std::
                  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karakanb[P]unblock-me-solver/src/Solver.cpp:180:16)>
                  ::push(&pStack_6c8,(value_type *)auStack_5a0);
                }
                if (vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Stack_4f0._M_p != &aStack_4e0) {
                  operator_delete(_Stack_4f0._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)auStack_510._0_8_ != &aStack_500) {
                  operator_delete((void *)auStack_510._0_8_);
                }
              }
              iVar36 = iVar36 + 1;
            } while (iVar36 != 4);
          }
          uVar27 = uVar27 + 1;
          uVar30 = ((long)vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        } while (uVar27 <= uVar30 && uVar30 - uVar27 != 0);
      }
      pmVar29 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                ::operator[](pmVar1,&kStack_428);
      memcpy(pmVar29,(Solver *)auStack_4b8,0x90);
      std::__cxx11::string::_M_assign((string *)&pmVar29->identifier);
      std::__cxx11::string::_M_assign((string *)&pmVar29->referrer);
      std::vector<Block,_std::allocator<Block>_>::operator=(&pmVar29->blocks,pvStack_670);
    }
    if (vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (a_Stack_408[0]._M_p != pcStack_628) {
      operator_delete(a_Stack_408[0]._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)kStack_428._M_dataplus._M_p != paStack_630) {
      operator_delete(kStack_428._M_dataplus._M_p);
    }
  } while (!bVar38);
  std::deque<Board,_std::allocator<Board>_>::~deque(&pStack_6c8.c);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&uStack_608);
  return;
}

Assistant:

void Solver::solve(int algorithm) {
    if (algorithm == BFS) {
        this->solveBFS();
    } else if (algorithm == DFS) {
        this->solveDFS();
    } else {
        this->solveDijkstra();
    }
}